

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Array<char>_>::truncate
          (ArrayBuilder<kj::Array<char>_> *this,char *__file,__off_t __length)

{
  Array<char> *pAVar1;
  Array<char> *pAVar2;
  char *pcVar3;
  size_t sVar4;
  Array<char> *pAVar5;
  
  pAVar2 = this->ptr;
  pAVar1 = this->pos;
  while (pAVar5 = pAVar1, pAVar2 + (long)__file < pAVar5) {
    pAVar1 = pAVar5 + -1;
    this->pos = pAVar1;
    pcVar3 = pAVar5[-1].ptr;
    if (pcVar3 != (char *)0x0) {
      sVar4 = pAVar5[-1].size_;
      pAVar1->ptr = (char *)0x0;
      pAVar5[-1].size_ = 0;
      (**(pAVar5[-1].disposer)->_vptr_ArrayDisposer)(pAVar5[-1].disposer,pcVar3,1,sVar4,sVar4,0);
      pAVar1 = this->pos;
    }
  }
  return (int)pAVar5;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }